

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O0

int physics_thread_main(void *arg)

{
  int iVar1;
  undefined1 local_28 [8];
  timespec ts;
  GLFWwindow *window;
  void *arg_local;
  
  ts.tv_nsec = (__syscall_slong_t)arg;
  while( true ) {
    mtx_lock(&thread_sync.particles_lock);
    while (iVar1 = glfwWindowShouldClose((GLFWwindow *)ts.tv_nsec),
          iVar1 == 0 && thread_sync.d_frame < thread_sync.p_frame) {
      clock_gettime(0,(timespec *)local_28);
      local_28 = (undefined1  [8])((ts.tv_sec + 100000000) / 1000000000 + (long)local_28);
      ts.tv_sec = (ts.tv_sec + 100000000) % 1000000000;
      cnd_timedwait(&thread_sync.d_done,&thread_sync.particles_lock,(timespec *)local_28);
    }
    iVar1 = glfwWindowShouldClose((GLFWwindow *)ts.tv_nsec);
    if (iVar1 != 0) break;
    particle_engine(thread_sync.t,thread_sync.dt);
    thread_sync.p_frame = thread_sync.p_frame + 1;
    mtx_unlock(&thread_sync.particles_lock);
    cnd_signal(&thread_sync.p_done);
  }
  return 0;
}

Assistant:

static int physics_thread_main(void* arg)
{
    GLFWwindow* window = arg;

    for (;;)
    {
        mtx_lock(&thread_sync.particles_lock);

        // Wait for particle drawing to be done
        while (!glfwWindowShouldClose(window) &&
               thread_sync.p_frame > thread_sync.d_frame)
        {
            struct timespec ts;
            clock_gettime(CLOCK_REALTIME, &ts);
            ts.tv_nsec += 100 * 1000 * 1000;
            ts.tv_sec += ts.tv_nsec / (1000 * 1000 * 1000);
            ts.tv_nsec %= 1000 * 1000 * 1000;
            cnd_timedwait(&thread_sync.d_done, &thread_sync.particles_lock, &ts);
        }

        if (glfwWindowShouldClose(window))
            break;

        // Update particles
        particle_engine(thread_sync.t, thread_sync.dt);

        // Update frame counter
        thread_sync.p_frame++;

        // Unlock mutex and signal drawing thread
        mtx_unlock(&thread_sync.particles_lock);
        cnd_signal(&thread_sync.p_done);
    }

    return 0;
}